

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2coords.h
# Opt level: O0

bool S2::FaceXYZtoUV(int face,S2Point *p,double *pu,double *pv)

{
  double dVar1;
  double *pv_local;
  double *pu_local;
  S2Point *p_local;
  int face_local;
  
  if (face < 3) {
    dVar1 = util::math::internal_vector::BasicVector<Vector3,_double,_3UL>::operator[]
                      ((BasicVector<Vector3,_double,_3UL> *)p,face);
    if (dVar1 <= 0.0) {
      return false;
    }
  }
  else {
    dVar1 = util::math::internal_vector::BasicVector<Vector3,_double,_3UL>::operator[]
                      ((BasicVector<Vector3,_double,_3UL> *)p,face + -3);
    if (0.0 <= dVar1) {
      return false;
    }
  }
  ValidFaceXYZtoUV(face,p,pu,pv);
  return true;
}

Assistant:

inline bool FaceXYZtoUV(int face, const S2Point& p,
                        double* pu, double* pv) {
  if (face < 3) {
    if (p[face] <= 0) return false;
  } else {
    if (p[face-3] >= 0) return false;
  }
  ValidFaceXYZtoUV(face, p, pu, pv);
  return true;
}